

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonwriter.cpp
# Opt level: O3

void valueContentToJson(QCborValue *v,QByteArray *json,int indent,bool compact)

{
  Type TVar1;
  char *pcVar2;
  qsizetype qVar3;
  char ch;
  qsizetype i;
  long in_FS_OFFSET;
  QStringView s;
  QByteArrayView data;
  undefined1 local_78 [16];
  qsizetype local_68;
  QString local_58;
  QByteArray local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  TVar1 = v->t;
  if (TVar1 < Map) {
    if (TVar1 == Integer) {
      QByteArray::number(&local_40,v->n,10);
      QByteArray::append(json,&local_40);
LAB_002f93d2:
      if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,1,0x10);
        }
      }
    }
    else {
      if (TVar1 == String) {
        QByteArray::append(json,'\"');
        local_78 = (undefined1  [16])0x0;
        local_68 = 0;
        QCborValue::toString(&local_58,(QCborValue *)v,(QString *)local_78);
        s.m_data = local_58.d.ptr;
        s.m_size = local_58.d.size;
        escapedString(&local_40,s);
        QByteArray::append(json,&local_40);
        if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,1,0x10);
          }
        }
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
          }
        }
        ch = '\"';
      }
      else {
        if (TVar1 != Array) goto LAB_002f9299;
        pcVar2 = "[\n";
        if (compact) {
          pcVar2 = "[";
        }
        QByteArray::append(json,pcVar2,-1);
        arrayContentToJson(v->container,json,(uint)!compact + indent,compact);
        QByteArray::QByteArray(&local_40,(long)(indent << 2),' ');
        QByteArray::append(json,&local_40);
        if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,1,0x10);
          }
        }
        ch = ']';
      }
LAB_002f938c:
      QByteArray::append(json,ch);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
    goto LAB_002f950a;
  }
  if (TVar1 < True) {
    if (TVar1 == Map) {
      pcVar2 = "{\n";
      if (compact) {
        pcVar2 = "{";
      }
      QByteArray::append(json,pcVar2,-1);
      objectContentToJson(v->container,json,(uint)!compact + indent,compact);
      QByteArray::QByteArray(&local_40,(long)(indent << 2),' ');
      QByteArray::append(json,&local_40);
      if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,1,0x10);
        }
      }
      ch = '}';
      goto LAB_002f938c;
    }
    if (TVar1 == False) {
      i = (json->d).size;
      if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_002f950a;
      pcVar2 = "false";
      qVar3 = 5;
      goto LAB_002f92bd;
    }
LAB_002f9299:
    i = (json->d).size;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
LAB_002f950a:
      __stack_chk_fail();
    }
    pcVar2 = "null";
  }
  else {
    if (TVar1 == Double) {
      if ((ulong)ABS((double)v->n) < 0x7ff0000000000000) {
        QByteArray::number(&local_40,(double)v->n,'g',-0x80);
        QByteArray::append(json,&local_40);
        goto LAB_002f93d2;
      }
      goto LAB_002f9299;
    }
    if (TVar1 != True) goto LAB_002f9299;
    i = (json->d).size;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_002f950a;
    pcVar2 = "true";
  }
  qVar3 = 4;
LAB_002f92bd:
  data.m_data = pcVar2;
  data.m_size = qVar3;
  QByteArray::insert(json,i,data);
  return;
}

Assistant:

static void valueContentToJson(const QCborValue &v, QByteArray &json, int indent, bool compact)
{
    QCborValue::Type type = v.type();
    switch (type) {
    case QCborValue::True:
        json += "true";
        break;
    case QCborValue::False:
        json += "false";
        break;
    case QCborValue::Integer:
        json += QByteArray::number(v.toInteger());
        break;
    case QCborValue::Double: {
        const double d = v.toDouble();
        if (qt_is_finite(d))
            json += QByteArray::number(d, 'g', QLocale::FloatingPointShortest);
        else
            json += "null"; // +INF || -INF || NaN (see RFC4627#section2.4)
        break;
    }
    case QCborValue::String:
        json += '"';
        json += escapedString(v.toString());
        json += '"';
        break;
    case QCborValue::Array:
        json += compact ? "[" : "[\n";
        arrayContentToJson(
                QJsonPrivate::Value::container(v), json, indent + (compact ? 0 : 1), compact);
        json += QByteArray(4*indent, ' ');
        json += ']';
        break;
    case QCborValue::Map:
        json += compact ? "{" : "{\n";
        objectContentToJson(
                QJsonPrivate::Value::container(v), json, indent + (compact ? 0 : 1), compact);
        json += QByteArray(4*indent, ' ');
        json += '}';
        break;
    case QCborValue::Null:
    default:
        json += "null";
    }
}